

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilBitMatrix.c
# Opt level: O3

void Extra_BitMatrixPrint(Extra_BitMat_t *pMat)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  
  putchar(10);
  uVar2 = pMat->nSize;
  if (0 < (int)uVar2) {
    iVar8 = 1;
    uVar7 = 0;
    iVar6 = iVar8;
    do {
      do {
        putchar(0x20);
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      uVar1 = uVar7 + 1;
      uVar5 = uVar1;
      if ((int)uVar1 < (int)uVar2) {
        do {
          pMat->nLookups = pMat->nLookups + 1;
          uVar3 = uVar5;
          if ((int)uVar7 < (int)uVar5) {
            uVar3 = uVar7;
          }
          uVar4 = uVar5;
          if ((int)uVar5 < (int)uVar7) {
            uVar4 = uVar7;
          }
          putchar((uint)((pMat->ppData[uVar3][uVar4 >> ((byte)pMat->nBitShift & 0x1f)] >>
                          (uVar4 & pMat->uMask & 0x1f) & 1) != 0) * 3 + 0x2e);
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
      putchar(10);
      iVar8 = iVar6 + 1;
      uVar7 = uVar1;
      iVar6 = iVar8;
    } while (uVar1 != uVar2);
  }
  return;
}

Assistant:

void Extra_BitMatrixPrint( Extra_BitMat_t * pMat )
{
    int i, k, nVars;
    printf( "\n" );
    nVars = Extra_BitMatrixReadSize( pMat );
    for ( i = 0; i < nVars; i++ )
    {
        for ( k = 0; k <= i; k++ )
            printf( " " );
        for ( k = i+1; k < nVars; k++ )
            if ( Extra_BitMatrixLookup1( pMat, i, k ) )
                printf( "1" );
            else
                printf( "." );
        printf( "\n" );
    }
}